

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares.c
# Opt level: O1

uint64_t aom_sum_sse_2d_i16_c(int16_t *src,int src_stride,int width,int height,int *sum)

{
  uint64_t uVar1;
  ulong uVar2;
  int iVar3;
  int16_t *srcp;
  int iVar4;
  int iVar5;
  
  iVar4 = 0;
  if (0 < height) {
    uVar1 = 0;
    do {
      if (0 < width) {
        iVar5 = *sum;
        uVar2 = 0;
        do {
          iVar3 = (int)src[uVar2];
          iVar5 = iVar5 + iVar3;
          uVar1 = uVar1 + (uint)(iVar3 * iVar3);
          uVar2 = uVar2 + 1;
        } while ((uint)width != uVar2);
        *sum = iVar5;
      }
      iVar4 = iVar4 + 1;
      src = src + src_stride;
    } while (iVar4 != height);
    return uVar1;
  }
  return 0;
}

Assistant:

uint64_t aom_sum_sse_2d_i16_c(const int16_t *src, int src_stride, int width,
                              int height, int *sum) {
  int r, c;
  int16_t *srcp = (int16_t *)src;
  int64_t ss = 0;

  for (r = 0; r < height; r++) {
    for (c = 0; c < width; c++) {
      const int16_t v = srcp[c];
      ss += v * v;
      *sum += v;
    }
    srcp += src_stride;
  }
  return ss;
}